

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void * __thiscall ncnn::UnlockedPoolAllocator::fastMalloc(UnlockedPoolAllocator *this,size_t size)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  const_iterator __position;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  ulong in_RSI;
  long in_RDI;
  void *ptr;
  void *ptr_1;
  size_t bs;
  iterator it;
  void *ptr_2;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff58;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff60;
  value_type *in_stack_ffffffffffffff68;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff70;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_50;
  void *local_48;
  ulong local_40;
  _Self local_38;
  _Self local_30;
  ulong local_28;
  void *local_10;
  ulong local_8;
  
  local_28 = in_RSI;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffff58);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar2 = std::operator!=(&local_30,&local_38);
    if (!bVar2) {
      local_8 = local_28;
      local_10 = (void *)0x0;
      iVar3 = posix_memalign(&local_10,0x40,local_28 + 0x40);
      if (iVar3 != 0) {
        local_10 = (void *)0x0;
      }
      pvVar1 = local_10;
      std::make_pair<unsigned_long&,void*&>
                ((unsigned_long *)(*(long *)(in_RDI + 8) + 0x20),(void **)in_stack_ffffffffffffff58)
      ;
      std::__cxx11::
      list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
      push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      return pvVar1;
    }
    ppVar4 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1924ff);
    local_40 = ppVar4->first;
    if ((local_28 <= local_40) && (local_40 * **(uint **)(in_RDI + 8) >> 8 <= local_28)) break;
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(&local_30);
  }
  ppVar4 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                     ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x19254a);
  local_48 = ppVar4->second;
  __position._M_node = (_List_node_base *)(*(long *)(in_RDI + 8) + 8);
  std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
            (&local_50,&local_30);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (in_stack_ffffffffffffff60,__position);
  this_00 = (list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
             *)(*(long *)(in_RDI + 8) + 0x20);
  std::make_pair<unsigned_long&,void*&>
            ((unsigned_long *)in_stack_ffffffffffffff60,(void **)in_stack_ffffffffffffff58);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(this_00,(value_type *)__position._M_node);
  return local_48;
}

Assistant:

void* UnlockedPoolAllocator::fastMalloc(size_t size)
{
    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->payouts.push_back(std::make_pair(bs, ptr));

            return ptr;
        }
    }

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts.push_back(std::make_pair(size, ptr));

    return ptr;
}